

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_32sto3u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  byte *pbVar1;
  int iVar2;
  OPJ_INT32 OVar3;
  int iVar4;
  OPJ_INT32 OVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  
  pbVar9 = pDst + 1;
  for (uVar6 = 0; uVar6 < (length & 0xfffffffffffffff8); uVar6 = uVar6 + 8) {
    uVar10 = pSrc[uVar6 + 2];
    iVar2 = pSrc[uVar6 + 3];
    OVar3 = pSrc[uVar6 + 4];
    uVar8 = pSrc[uVar6 + 5];
    iVar4 = pSrc[uVar6 + 6];
    OVar5 = pSrc[uVar6 + 7];
    pbVar9[-1] = (byte)(uVar10 >> 1) | (byte)(pSrc[uVar6 + 1] << 2) | (byte)(pSrc[uVar6] << 5);
    *pbVar9 = (byte)(uVar8 >> 2) | (char)OVar3 * '\x02' | (byte)(iVar2 << 4) | (byte)(uVar10 << 7);
    pbVar9[1] = (byte)(iVar4 << 3) | (byte)(uVar8 << 6) | (byte)OVar5;
    pbVar9 = pbVar9 + 3;
  }
  if ((length & 7) != 0) {
    pbVar1 = pbVar9 + -1;
    uVar10 = pSrc[uVar6];
    uVar8 = (uint)(length & 7);
    if (uVar8 == 1) {
      sVar7 = 5;
      pbVar9 = pbVar1;
    }
    else {
      uVar10 = uVar10 << 3 | pSrc[uVar6 + 1];
      if (uVar8 < 3) {
        sVar7 = 2;
        pbVar9 = pbVar1;
      }
      else {
        *pbVar1 = (byte)((uint)pSrc[uVar6 + 2] >> 1) | (byte)(uVar10 << 2);
        uVar10 = pSrc[uVar6 + 2] & 1;
        if (uVar8 == 3) {
          sVar7 = 7;
        }
        else {
          uVar10 = uVar10 << 3 | pSrc[uVar6 + 3];
          if (uVar8 < 5) {
            sVar7 = 4;
          }
          else {
            uVar10 = uVar10 << 3 | pSrc[uVar6 + 4];
            if (uVar8 == 5) {
              sVar7 = 1;
            }
            else {
              *pbVar9 = (byte)((uint)pSrc[uVar6 + 5] >> 2) | (char)uVar10 * '\x02';
              pbVar9 = pbVar9 + 1;
              uVar10 = pSrc[uVar6 + 5] & 3;
              if (uVar8 == 7) {
                uVar10 = uVar10 << 3 | pSrc[uVar6 + 6];
                sVar7 = 3;
              }
              else {
                sVar7 = 6;
              }
            }
          }
        }
      }
    }
    *pbVar9 = (byte)(uVar10 << sVar7);
  }
  return;
}

Assistant:

static void tif_32sto3u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i+4];
		OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i+5];
		OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i+6];
		OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i+7];
			
		*pDst++ = (OPJ_BYTE)((src0 << 5) | (src1 << 2) | (src2 >> 1));
		*pDst++ = (OPJ_BYTE)((src2 << 7) | (src3 << 4) | (src4 << 1) | (src5 >> 2));
		*pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 << 3) | (src7));
	}
		
	if (length & 7U) {
		unsigned int trailing = 0U;
		int remaining = 8U;
		length &= 7U;
		PUTBITS((OPJ_UINT32)pSrc[i+0], 3)
		if (length > 1U) {
			PUTBITS((OPJ_UINT32)pSrc[i+1], 3)
			if (length > 2U) {
				PUTBITS((OPJ_UINT32)pSrc[i+2], 3)
				if (length > 3U) {
					PUTBITS((OPJ_UINT32)pSrc[i+3], 3)
					if (length > 4U) {
						PUTBITS((OPJ_UINT32)pSrc[i+4], 3)
						if (length > 5U) {
							PUTBITS((OPJ_UINT32)pSrc[i+5], 3)
							if (length > 6U) {
								PUTBITS((OPJ_UINT32)pSrc[i+6], 3)
							}
						}
					}
				}
			}
		}
		FLUSHBITS()
	}
}